

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-generated-function-mockers.h
# Opt level: O2

MockSpec<unsigned_char_(unsigned_short)> * __thiscall
testing::internal::FunctionMocker<unsigned_char_(unsigned_short)>::With
          (MockSpec<unsigned_char_(unsigned_short)> *__return_storage_ptr__,
          FunctionMocker<unsigned_char_(unsigned_short)> *this,Matcher<unsigned_short> *m1)

{
  MatcherBase<unsigned_short> local_30;
  
  Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_30,m1);
  __return_storage_ptr__->function_mocker_ =
       &this->super_FunctionMockerBase<unsigned_char_(unsigned_short)>;
  Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&__return_storage_ptr__->matchers_,
             (Matcher<unsigned_short> *)&local_30);
  MatcherBase<unsigned_short>::~MatcherBase(&local_30);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(const Matcher<A1>& m1) {
    return MockSpec<F>(this, ::testing::make_tuple(m1));
  }